

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O0

bool __thiscall
llbuild::buildsystem::ShellCommand::configureAttribute
          (ShellCommand *this,ConfigureContext *ctx,StringRef name,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> values)

{
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> values_00;
  StringRef name_00;
  int iVar1;
  size_t N;
  BuildFileDelegate *pBVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool local_191;
  StringRef local_148;
  char *local_138;
  size_t local_130;
  StringRef local_128;
  pair<llvm::StringRef,_llvm::StringRef> local_118;
  iterator local_f8;
  pair<llvm::StringRef,_llvm::StringRef> *entry;
  iterator __end2;
  iterator __begin2;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *__range2;
  char *local_c8;
  size_t local_c0;
  ConfigureContext *local_b8;
  ConfigureContext *ctx_local;
  ShellCommand *this_local;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> values_local;
  StringRef name_local;
  char *local_50;
  size_t local_48;
  char **local_40;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *local_38;
  size_t local_30;
  size_t local_28;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *local_20;
  char *local_18;
  int local_c;
  
  values_local.Data = (pair<llvm::StringRef,_llvm::StringRef> *)values.Length;
  this_local = (ShellCommand *)values.Data;
  local_c8 = name.Data;
  __range2 = (ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *)0x36c820;
  local_c0 = name.Length;
  local_b8 = ctx;
  ctx_local = (ConfigureContext *)this;
  values_local.Length = (size_type)local_c8;
  local_30 = strlen("env");
  local_50 = local_c8;
  local_48 = local_c0;
  local_38 = __range2;
  local_40 = &local_50;
  local_191 = false;
  if (local_c0 == local_30) {
    local_18 = local_c8;
    local_20 = __range2;
    local_28 = local_30;
    if (local_30 == 0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(local_c8,__range2,local_30);
    }
    local_191 = local_c == 0;
  }
  if (local_191) {
    llvm::SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_>::clear
              (&(this->env).super_SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_>);
    N = llvm::ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>::size
                  ((ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *)&this_local);
    llvm::SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_>::reserve
              (&(this->env).super_SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_>,N);
    __begin2 = (iterator)&this_local;
    __end2 = llvm::ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>::begin
                       ((ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *)__begin2);
    entry = llvm::ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>::end
                      ((ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> *)__begin2);
    for (; __end2 != entry; __end2 = __end2 + 1) {
      local_f8 = __end2;
      pBVar2 = ConfigureContext::getDelegate(local_b8);
      local_138 = (local_f8->first).Data;
      local_130 = (local_f8->first).Length;
      iVar1 = (*pBVar2->_vptr_BuildFileDelegate[2])(pBVar2,local_138,local_130);
      local_128.Data = (char *)CONCAT44(extraout_var,iVar1);
      pBVar2 = ConfigureContext::getDelegate(local_b8);
      iVar1 = (*pBVar2->_vptr_BuildFileDelegate[2])
                        (pBVar2,(local_f8->second).Data,(local_f8->second).Length);
      local_148.Data = (char *)CONCAT44(extraout_var_00,iVar1);
      std::make_pair<llvm::StringRef,llvm::StringRef>(&local_118,&local_128,&local_148);
      llvm::SmallVectorImpl<std::pair<llvm::StringRef,llvm::StringRef>>::
      emplace_back<std::pair<llvm::StringRef,llvm::StringRef>>
                ((SmallVectorImpl<std::pair<llvm::StringRef,llvm::StringRef>> *)&this->env,
                 &local_118);
    }
    name_local.Length._7_1_ = true;
  }
  else {
    name_00.Length = name.Length;
    name_00.Data = (char *)values_local.Length;
    values_00.Length = (size_type)values_local.Data;
    values_00.Data = (pair<llvm::StringRef,_llvm::StringRef> *)this_local;
    name_local.Length._7_1_ =
         ExternalCommand::configureAttribute
                   (&this->super_ExternalCommand,local_b8,name_00,values_00);
  }
  return name_local.Length._7_1_;
}

Assistant:

bool ShellCommand::configureAttribute(
    const ConfigureContext& ctx, StringRef name,
    ArrayRef<std::pair<StringRef, StringRef>> values) {
  if (name == "env") {
    env.clear();
    env.reserve(values.size());
    for (const auto& entry: values) {
      env.emplace_back(
          std::make_pair(
              ctx.getDelegate().getInternedString(entry.first),
              ctx.getDelegate().getInternedString(entry.second)));
    }
  } else {
    return ExternalCommand::configureAttribute(ctx, name, values);
  }

  return true;
}